

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void config_init_default(trans2p_config *conf)

{
  (conf->tun).enabled = false;
  strncpy((char *)conf,"i2p0",0x100);
  (conf->tun).mtu = 0x5dc;
  inet_pton(2,"10.55.0.1",&(conf->tun).addr);
  inet_pton(2,"255.255.0.0",&(conf->tun).netmask);
  strncpy((conf->i2cp).addr,"127.0.0.1",0x100);
  (conf->i2cp).port = 0x1de6;
  (conf->i2cp).enabled = true;
  strncpy((conf->dns).addr,"127.0.0.1",0x100);
  (conf->dns).port = 0x15b1;
  return;
}

Assistant:

void config_init_default(struct trans2p_config * conf)
{
  conf->tun.enabled = false;
  strncpy(conf->tun.ifname, "i2p0", sizeof(conf->tun.ifname));
  conf->tun.mtu = 1500;
  inet_pton(AF_INET, "10.55.0.1", &conf->tun.addr);
  inet_pton(AF_INET, "255.255.0.0", &conf->tun.netmask);
  
  strncpy(conf->i2cp.addr, "127.0.0.1", sizeof(conf->i2cp.addr));
  conf->i2cp.port = 7654;
  conf->i2cp.enabled = true;

  strncpy(conf->dns.addr, "127.0.0.1", sizeof(conf->dns.addr));
  conf->dns.port = 5553;
}